

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall efsw::String::insert(String *this,size_t pos1,char *s,size_t n)

{
  String tmp;
  String local_40;
  
  String(&local_40,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  insert(&this->mString,pos1,local_40.mString._M_dataplus._M_p,n);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  return this;
}

Assistant:

String& String::insert( size_t pos1, const char* s, size_t n ) {
	String tmp( s );

	mString.insert( pos1, tmp.data(), n );

	return *this;
}